

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::OnCallSpec(OnCallSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
             *this,char *a_file,int a_line,ArgumentMatcherTuple *matchers)

{
  (this->super_UntypedOnCallSpecBase).file_ = a_file;
  (this->super_UntypedOnCallSpecBase).line_ = a_line;
  (this->super_UntypedOnCallSpecBase).last_clause_ = kNone;
  std::
  _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
  ::_Tuple_impl(&(this->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                ,&matchers->
                  super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
               );
  A<std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>&,ot::commissioner::Config_const&>const&>
            ();
  (this->action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->action_).fun_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->action_).fun_.super__Function_base._M_functor + 8) = 0;
  return;
}

Assistant:

OnCallSpec(const char* a_file, int a_line,
             const ArgumentMatcherTuple& matchers)
      : UntypedOnCallSpecBase(a_file, a_line),
        matchers_(matchers),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()) {}